

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<bool,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
ParallelFunctionAnalysis
          (ParallelFunctionAnalysis<bool,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> *this,
          Module *wasm,Func *work)

{
  pointer puVar1;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar2;
  Func local_60;
  _Head_base<0UL,_wasm::Function_*,_false> local_40;
  Func *local_38;
  
  this->wasm = wasm;
  *(undefined4 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined1 **)&this->field_0x20 = &this->field_0x10;
  *(undefined1 **)&this->field_0x28 = &this->field_0x10;
  *(undefined8 *)&this->field_0x30 = 0;
  puVar1 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = work;
  for (puVar2 = (wasm->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    local_40._M_head_impl =
         (puVar2->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    std::
    map<wasm::Function_*,_bool,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>_>
    ::operator[]((map<wasm::Function_*,_bool,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>_>
                  *)&this->field_0x8,&local_40._M_head_impl);
  }
  std::function<void_(wasm::Function_*,_bool_&)>::function
            ((function<void_(wasm::Function_*,_bool_&)> *)&local_60,
             (function<void_(wasm::Function_*,_bool_&)> *)local_38);
  doAnalysis(this,&local_60);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  return;
}

Assistant:

ParallelFunctionAnalysis(Module& wasm, Func work) : wasm(wasm) {
    // Fill in the map as we operate on it in parallel (each function to its own
    // entry).
    for (auto& func : wasm.functions) {
      map[func.get()];
    }

    doAnalysis(work);
  }